

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O0

void lysp_include_free_(lysf_ctx *ctx,lysp_include *include,ly_bool main_module)

{
  lysp_ext_instance *local_38;
  lysp_ext_instance *local_28;
  uint64_t c__;
  ly_bool main_module_local;
  lysp_include *include_local;
  lysf_ctx *ctx_local;
  
  if ((main_module != '\0') && (include->submodule != (lysp_submodule *)0x0)) {
    lysp_module_free(ctx,(lysp_module *)include->submodule);
  }
  lydict_remove(ctx->ctx,include->name);
  lydict_remove(ctx->ctx,include->dsc);
  lydict_remove(ctx->ctx,include->ref);
  local_28 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (include->exts == (lysp_ext_instance *)0x0) {
      local_38 = (lysp_ext_instance *)0x0;
    }
    else {
      local_38 = include->exts[-1].exts;
    }
    if (local_38 <= local_28) break;
    lysp_ext_instance_free(ctx,include->exts + (long)local_28);
    local_28 = (lysp_ext_instance *)((long)&local_28->name + 1);
  }
  if (include->exts != (lysp_ext_instance *)0x0) {
    free(&include->exts[-1].exts);
  }
  return;
}

Assistant:

static void
lysp_include_free_(struct lysf_ctx *ctx, struct lysp_include *include, ly_bool main_module)
{
    if (main_module && include->submodule) {
        lysp_module_free(ctx, (struct lysp_module *)include->submodule);
    }
    lydict_remove(ctx->ctx, include->name);
    lydict_remove(ctx->ctx, include->dsc);
    lydict_remove(ctx->ctx, include->ref);
    FREE_ARRAY(ctx, include->exts, lysp_ext_instance_free);
}